

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O2

string * JoinStringPiece_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<StringPiece,_std::allocator<StringPiece>_> *list,char sep)

{
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  bool bVar5;
  allocator<char> local_29;
  
  pSVar2 = (list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar2 == pSVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    lVar3 = (long)pSVar1 - (long)pSVar2 >> 4;
    do {
      bVar5 = lVar3 != 0;
      lVar3 = lVar3 + -1;
    } while (bVar5);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    lVar3 = 8;
    for (uVar4 = 0;
        pSVar2 = (list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4);
        uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        pSVar2 = (list->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      std::__cxx11::string::append
                ((char *)__return_storage_ptr__,*(ulong *)((long)pSVar2 + lVar3 + -8));
      lVar3 = lVar3 + 0x10;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string JoinStringPiece(const vector<StringPiece>& list, char sep) {
  if (list.empty()) {
    return "";
  }

  string ret;

  {
    size_t cap = list.size() - 1;
    for (size_t i = 0; i < list.size(); ++i) {
      cap += list[i].len_;
    }
    ret.reserve(cap);
  }

  for (size_t i = 0; i < list.size(); ++i) {
    if (i != 0) {
      ret += sep;
    }
    ret.append(list[i].str_, list[i].len_);
  }

  return ret;
}